

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
get_next_filled_position
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,int pos,bool exclusive)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  undefined7 in_register_00000011;
  int iVar4;
  
  uVar2 = (ulong)(uint)pos;
  if ((int)CONCAT71(in_register_00000011,exclusive) != 0) {
    uVar1 = pos + 1;
    uVar2 = (ulong)uVar1;
    if (uVar1 == this->data_capacity_) {
      return uVar1;
    }
  }
  iVar4 = (int)uVar2 >> 6;
  uVar2 = (this->bitmap_[iVar4] >> (uVar2 & 0x3f)) << (uVar2 & 0x3f);
  if (uVar2 == 0) {
    lVar3 = (long)iVar4 + 1;
    do {
      if (this->bitmap_size_ <= lVar3) {
        return this->data_capacity_;
      }
      uVar2 = this->bitmap_[lVar3];
      lVar3 = lVar3 + 1;
    } while (uVar2 == 0);
    iVar4 = (int)lVar3 + -1;
  }
  uVar1 = 0;
  for (; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
    uVar1 = uVar1 + 1;
  }
  return uVar1 | iVar4 << 6;
}

Assistant:

int get_next_filled_position(int pos, bool exclusive) const {
    if (exclusive) {
      pos++;
      if (pos == data_capacity_) {
        return data_capacity_;
      }
    }

    int curBitmapIdx = pos >> 6;
    uint64_t curBitmapData = bitmap_[curBitmapIdx];

    // Zero out extra bits
    int bit_pos = pos - (curBitmapIdx << 6);
    curBitmapData &= ~((1ULL << (bit_pos)) - 1);

    while (curBitmapData == 0) {
      curBitmapIdx++;
      if (curBitmapIdx >= bitmap_size_) {
        return data_capacity_;
      }
      curBitmapData = bitmap_[curBitmapIdx];
    }
    uint64_t bit = extract_rightmost_one(curBitmapData);
    return get_offset(curBitmapIdx, bit);
  }